

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * namePop(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar **ppxVar2;
  uint uVar3;
  xmlChar *pxVar4;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->nameNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->nameNr = uVar3;
      ppxVar2 = ctxt->nameTab;
      if (iVar1 == 1) {
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        pxVar4 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->name = pxVar4;
      pxVar4 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlChar *)0x0;
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
namePop(xmlParserCtxtPtr ctxt)
{
    const xmlChar *ret;

    if ((ctxt == NULL) || (ctxt->nameNr <= 0))
        return (NULL);
    ctxt->nameNr--;
    if (ctxt->nameNr > 0)
        ctxt->name = ctxt->nameTab[ctxt->nameNr - 1];
    else
        ctxt->name = NULL;
    ret = ctxt->nameTab[ctxt->nameNr];
    ctxt->nameTab[ctxt->nameNr] = NULL;
    return (ret);
}